

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void C_DeinitConsole(void)

{
  GameAtExit *pGVar1;
  History *pHVar2;
  FBaseCVar *pFVar3;
  FConsoleCommand *pFVar4;
  FConsoleBuffer *pFVar5;
  uint32 uVar6;
  uint uVar7;
  char *cmd_00;
  FConsoleCommand *next_3;
  FConsoleCommand *cmd_1;
  size_t i;
  FBaseCVar **nextp;
  FBaseCVar *next;
  FBaseCVar *var;
  History *next_2;
  History *hist;
  GameAtExit *next_1;
  GameAtExit *cmd;
  
  next_1 = ExitCmdList;
  pGVar1 = next_1;
  while (next_1 = pGVar1, next_1 != (GameAtExit *)0x0) {
    pGVar1 = next_1->Next;
    cmd_00 = FString::LockBuffer(&next_1->Command);
    AddCommandString(cmd_00,0);
    if (next_1 != (GameAtExit *)0x0) {
      GameAtExit::~GameAtExit(next_1);
      operator_delete(next_1,0x10);
    }
  }
  next_2 = HistTail;
  pHVar2 = next_2;
  while (next_2 = pHVar2, next_2 != (History *)0x0) {
    pHVar2 = next_2->Newer;
    if (next_2 != (History *)0x0) {
      History::~History(next_2);
      operator_delete(next_2,0x18);
    }
  }
  HistPos = (History *)0x0;
  HistHead = (History *)0x0;
  HistTail = (History *)0x0;
  next = CVars;
  i = (size_t)&CVars;
  while (next != (FBaseCVar *)0x0) {
    pFVar3 = next->m_Next;
    uVar6 = FBaseCVar::GetFlags(next);
    if ((uVar6 & 0x20) == 0) {
      i = (size_t)&next->m_Next;
      next = pFVar3;
    }
    else {
      if (next != (FBaseCVar *)0x0) {
        (*next->_vptr_FBaseCVar[1])();
      }
      *(FBaseCVar **)i = pFVar3;
      next = pFVar3;
    }
  }
  for (cmd_1 = (FConsoleCommand *)0x0; cmd_1 < (FConsoleCommand *)0xfb;
      cmd_1 = (FConsoleCommand *)((long)&cmd_1->_vptr_FConsoleCommand + 1)) {
    pFVar4 = Commands[(long)cmd_1];
    while (next_3 = pFVar4, next_3 != (FConsoleCommand *)0x0) {
      pFVar4 = next_3->m_Next;
      uVar7 = (*next_3->_vptr_FConsoleCommand[2])();
      if (((uVar7 & 1) != 0) && (next_3 != (FConsoleCommand *)0x0)) {
        (*next_3->_vptr_FConsoleCommand[1])();
      }
    }
  }
  C_ClearTabCommands();
  if (work != (char *)0x0) {
    free(work);
    work = (char *)0x0;
    worklen = 0;
  }
  pFVar5 = conbuffer;
  if (conbuffer != (FConsoleBuffer *)0x0) {
    if (conbuffer != (FConsoleBuffer *)0x0) {
      FConsoleBuffer::~FConsoleBuffer(conbuffer);
      operator_delete(pFVar5,0x68);
    }
    conbuffer = (FConsoleBuffer *)0x0;
  }
  return;
}

Assistant:

void C_DeinitConsole ()
{
	GameAtExit *cmd = ExitCmdList;

	while (cmd != NULL)
	{
		GameAtExit *next = cmd->Next;
		AddCommandString (cmd->Command.LockBuffer());
		delete cmd;
		cmd = next;
	}

	// Free command history
	History *hist = HistTail;

	while (hist != NULL)
	{
		History *next = hist->Newer;
		delete hist;
		hist = next;
	}
	HistTail = HistHead = HistPos = NULL;

	// Free cvars allocated at runtime
	FBaseCVar *var, *next, **nextp;
	for (var = CVars, nextp = &CVars; var != NULL; var = next)
	{
		next = var->m_Next;
		if (var->GetFlags() & CVAR_UNSETTABLE)
		{
			delete var;
			*nextp = next;
		}
		else
		{
			nextp = &var->m_Next;
		}
	}

	// Free alias commands. (i.e. The "commands" that can be allocated
	// at runtime.)
	for (size_t i = 0; i < countof(Commands); ++i)
	{
		FConsoleCommand *cmd = Commands[i];

		while (cmd != NULL)
		{
			FConsoleCommand *next = cmd->m_Next;
			if (cmd->IsAlias())
			{
				delete cmd;
			}
			cmd = next;
		}
	}

	// Make sure all tab commands are cleared before the memory for
	// their names is deallocated.
	C_ClearTabCommands ();

	// Free AddToConsole()'s work buffer
	if (work != NULL)
	{
		free (work);
		work = NULL;
		worklen = 0;
	}

	if (conbuffer != NULL)
	{
		delete conbuffer;
		conbuffer = NULL;
	}
}